

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatCnfReader.c
# Opt level: O2

int xSAT_ReadInt(char **pIn)

{
  char cVar1;
  ushort uVar2;
  int iVar3;
  ushort **ppuVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  
  ppuVar4 = __ctype_b_loc();
  pcVar5 = *pIn;
  while (cVar1 = *pcVar5, (*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0) {
    pcVar5 = pcVar5 + 1;
    *pIn = pcVar5;
  }
  if ((cVar1 == '+') || (cVar1 == '-')) {
    pcVar5 = pcVar5 + 1;
    *pIn = pcVar5;
  }
  lVar6 = (long)*pcVar5;
  uVar2 = (*ppuVar4)[lVar6];
  if ((uVar2 >> 0xb & 1) != 0) {
    iVar7 = 0;
    while (pcVar5 = pcVar5 + 1, (uVar2 >> 0xb & 1) != 0) {
      iVar7 = iVar7 * 10 + (int)(char)lVar6 + -0x30;
      *pIn = pcVar5;
      lVar6 = (long)*pcVar5;
      uVar2 = (*ppuVar4)[lVar6];
    }
    iVar3 = -iVar7;
    if (cVar1 != '-') {
      iVar3 = iVar7;
    }
    return iVar3;
  }
  fprintf(_stderr,"PARSE ERROR! Unexpected char: %c\n");
  exit(1);
}

Assistant:

static int xSAT_ReadInt( char ** pIn )
{
    int val = 0;
    int neg = 0;

    for(; isspace(**pIn); (*pIn)++);
    if ( **pIn == '-' )
        neg = 1,
        (*pIn)++;
    else if ( **pIn == '+' )
        (*pIn)++;
    if ( !isdigit(**pIn) )
        fprintf(stderr, "PARSE ERROR! Unexpected char: %c\n", **pIn),
        exit(1);
    while ( isdigit(**pIn) )
        val = val*10 + (**pIn - '0'),
        (*pIn)++;
    return neg ? -val : val;
}